

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  uint32 uVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  int in_ESI;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *in_RDI;
  UnknownField *field;
  int i;
  int left;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar7;
  int iVar8;
  
  iVar8 = 0;
  iVar7 = 0;
  while( true ) {
    uVar3 = (ulong)iVar7;
    sVar4 = std::
            vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ::size(in_RDI);
    if (sVar4 <= uVar3) break;
    pvVar5 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](in_RDI,(long)iVar7);
    iVar2 = UnknownField::number(pvVar5);
    if (iVar2 == in_ESI) {
      UnknownField::Delete(pvVar5);
    }
    else {
      if (iVar7 != iVar8) {
        pvVar5 = std::
                 vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ::operator[](in_RDI,(long)iVar7);
        pvVar6 = std::
                 vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 ::operator[](in_RDI,(long)iVar8);
        uVar1 = pvVar5->type_;
        pvVar6->number_ = pvVar5->number_;
        pvVar6->type_ = uVar1;
        pvVar6->data_ = pvVar5->data_;
      }
      iVar8 = iVar8 + 1;
    }
    iVar7 = iVar7 + 1;
  }
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  resize((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         CONCAT44(in_ESI,iVar8),CONCAT44(iVar7,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.resize(left);
}